

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execJmp<(moira::Instr)65,(moira::Mode)6,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 addr;
  Moira *in_RDI;
  AEStackFrame frame;
  int delay [12];
  u32 ea;
  int src;
  u32 oldpc;
  int in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffffa8 [16];
  undefined1 local_48 [4];
  u32 in_stack_ffffffffffffffbc;
  Moira *in_stack_ffffffffffffffc0;
  
  addr = computeEA<(moira::Mode)6,(moira::Size)4,2ul>
                   (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  memset(local_48,0,0x30);
  (*in_RDI->_vptr_Moira[0x19])(in_RDI,4);
  bVar1 = misaligned<(moira::Size)2>(in_RDI,addr);
  if (bVar1) {
    frame = makeFrame<0ul>(in_stack_ffffffffffffffa8._8_8_,in_stack_ffffffffffffffa8._4_4_,
                           in_stack_ffffffffffffffa8._0_4_);
    execAddressError(in_RDI,frame,in_stack_ffffffffffffff9c);
  }
  else {
    (in_RDI->reg).pc = addr;
    fullPrefetch<4ul,0>(in_stack_ffffffffffffffa8._8_8_);
  }
  return;
}

Assistant:

void
Moira::execJmp(u16 opcode)
{
    u32 oldpc = reg.pc;
    
    int src = _____________xxx(opcode);
    u32 ea  = computeEA <M,Long, SKIP_LAST_READ> (src);
    
    const int delay[] = { 0,0,0,0,0,2,4,2,0,2,4,0 };
    sync(delay[M]);
    
    // Check for address error
    if (misaligned<Word>(ea)) {
        execAddressError(makeFrame(ea, oldpc));
        return;
    }
    
    // Jump to new address
    reg.pc = ea;

    // Fill the prefetch queue
    fullPrefetch<POLLIPL>();
}